

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  U32 *pUVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong *puVar12;
  ulong *puVar13;
  seqDef *psVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong *puVar18;
  ulong *puVar19;
  uint uVar20;
  BYTE *pStart_3;
  uint uVar21;
  BYTE *pBVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong uVar27;
  ulong uVar28;
  BYTE *pBVar29;
  ulong uVar30;
  ulong *puVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  ulong *puVar36;
  uint uVar37;
  U32 UVar38;
  uint uVar39;
  BYTE *pStart;
  BYTE *pInLoopLimit;
  long local_98;
  ulong *local_70;
  
  puVar4 = (ulong *)((long)src + srcSize);
  puVar26 = (ulong *)((long)src + (srcSize - 8));
  pBVar22 = (ms->window).base + (ms->window).dictLimit;
  uVar5 = rep[1];
  puVar36 = (ulong *)((ulong)((int)src == (int)pBVar22) + (long)src);
  uVar32 = (int)puVar36 - (int)pBVar22;
  uVar30 = (ulong)uVar5;
  if (uVar32 < uVar5) {
    uVar30 = 0;
  }
  uVar39 = (uint)uVar30;
  uVar6 = *rep;
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar28 = (ulong)uVar6;
  if (uVar32 < uVar6) {
    uVar28 = 0;
  }
  uVar20 = (uint)uVar28;
  if (puVar26 <= puVar36) {
LAB_004def2f:
    uVar11 = 0;
    if (uVar32 < uVar5) {
      uVar11 = uVar5;
    }
    if (uVar32 < uVar6) {
      uVar11 = uVar6;
    }
    if (uVar20 == 0) {
      uVar20 = uVar11;
    }
    if (uVar39 != 0) {
      uVar11 = uVar39;
    }
    *rep = uVar20;
    rep[1] = uVar11;
    return (long)puVar4 - (long)src;
  }
  puVar1 = (ulong *)((long)puVar4 - 7);
  puVar2 = (ulong *)((long)puVar4 - 3);
  puVar3 = (ulong *)((long)puVar4 - 1);
LAB_004ddf09:
  uVar39 = (uint)uVar30;
  uVar20 = (uint)uVar28;
  lVar33 = -uVar28;
  if (uVar20 == 0) {
    uVar23 = 0;
  }
  else {
    uVar23 = 0;
    if (*(int *)((long)((long)puVar36 + 1U) - uVar28) == *(int *)((long)puVar36 + 1)) {
      puVar31 = (ulong *)((long)puVar36 + 5);
      puVar13 = (ulong *)((long)puVar36 + lVar33 + 5);
      puVar19 = puVar31;
      if (puVar31 < puVar1) {
        if (*puVar13 == *puVar31) {
          lVar16 = 0;
          do {
            puVar19 = (ulong *)((long)puVar36 + lVar16 + 0xd);
            if (puVar1 <= puVar19) {
              puVar13 = (ulong *)((long)puVar36 + lVar33 + lVar16 + 0xd);
              puVar19 = (ulong *)((long)puVar36 + lVar16 + 0xd);
              goto LAB_004ddfc0;
            }
            uVar23 = *(ulong *)((long)puVar36 + lVar16 + lVar33 + 0xd);
            uVar27 = *puVar19;
            lVar16 = lVar16 + 8;
          } while (uVar23 == uVar27);
          uVar27 = uVar27 ^ uVar23;
          uVar23 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
            }
          }
          uVar23 = (uVar23 >> 3 & 0x1fffffff) + lVar16;
        }
        else {
          uVar27 = *puVar31 ^ *puVar13;
          uVar23 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
            }
          }
          uVar23 = uVar23 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_004ddfc0:
        if ((puVar19 < puVar2) && ((int)*puVar13 == (int)*puVar19)) {
          puVar19 = (ulong *)((long)puVar19 + 4);
          puVar13 = (ulong *)((long)puVar13 + 4);
        }
        if ((puVar19 < puVar3) && ((short)*puVar13 == (short)*puVar19)) {
          puVar19 = (ulong *)((long)puVar19 + 2);
          puVar13 = (ulong *)((long)puVar13 + 2);
        }
        if (puVar19 < puVar4) {
          puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar13 == (char)*puVar19));
        }
        uVar23 = (long)puVar19 - (long)puVar31;
      }
      uVar23 = uVar23 + 4;
    }
  }
  uVar11 = (ms->cParams).minMatch;
  UVar38 = (U32)puVar36;
  if (uVar11 - 6 < 2) {
    uVar11 = (ms->cParams).chainLog;
    uVar35 = 1 << ((byte)uVar11 & 0x1f);
    pUVar8 = ms->chainTable;
    pBVar29 = (ms->window).base;
    uVar21 = (ms->window).lowLimit;
    uVar37 = UVar38 - (int)pBVar29;
    uVar9 = uVar37 - uVar35;
    if (uVar37 < uVar35) {
      uVar9 = 0;
    }
    uVar7 = (ms->cParams).searchLog;
    uVar11 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                        (BYTE *)(ulong)(ms->cParams).hashLog,UVar38);
    if (uVar21 < uVar11) {
      iVar15 = 1 << ((byte)uVar7 & 0x1f);
      uVar27 = 999999999;
      uVar17 = 3;
      do {
        puVar31 = (ulong *)(pBVar29 + uVar11);
        if (*(char *)(uVar17 + (long)puVar31) == *(char *)((long)puVar36 + uVar17)) {
          puVar19 = puVar36;
          if (puVar36 < puVar1) {
            if (*puVar31 == *puVar36) {
              lVar16 = (ulong)uVar11 + 8;
              lVar34 = 0;
              do {
                puVar19 = (ulong *)((long)puVar36 + lVar34 + 8);
                if (puVar1 <= puVar19) {
                  puVar31 = (ulong *)(pBVar29 + lVar34 + lVar16);
                  goto LAB_004de14d;
                }
                lVar10 = lVar34 + lVar16;
                lVar34 = lVar34 + 8;
              } while (*(ulong *)(pBVar29 + lVar10) == *puVar19);
              uVar24 = *puVar19 ^ *(ulong *)(pBVar29 + lVar10);
              uVar25 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar25 = (uVar25 >> 3 & 0x1fffffff) + lVar34;
            }
            else {
              uVar24 = *puVar36 ^ *puVar31;
              uVar25 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar25 = uVar25 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_004de14d:
            if ((puVar19 < puVar2) && ((int)*puVar31 == (int)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar19 < puVar3) && ((short)*puVar31 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar19 < puVar4) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar31 == (char)*puVar19));
            }
            uVar25 = (long)puVar19 - (long)puVar36;
          }
          if ((uVar17 < uVar25) &&
             (uVar27 = (ulong)((uVar37 + 2) - uVar11), uVar17 = uVar25,
             (ulong *)((long)puVar36 + uVar25) == puVar4)) goto LAB_004de52f;
        }
        uVar25 = uVar17;
        if ((uVar11 <= uVar9) ||
           ((uVar11 = pUVar8[uVar11 & uVar35 - 1], uVar11 <= uVar21 ||
            (iVar15 = iVar15 + -1, uVar17 = uVar25, iVar15 == 0)))) goto LAB_004de52f;
      } while( true );
    }
  }
  else if (uVar11 == 5) {
    uVar11 = (ms->cParams).chainLog;
    uVar35 = 1 << ((byte)uVar11 & 0x1f);
    pUVar8 = ms->chainTable;
    pBVar29 = (ms->window).base;
    uVar21 = (ms->window).lowLimit;
    uVar37 = UVar38 - (int)pBVar29;
    uVar9 = uVar37 - uVar35;
    if (uVar37 < uVar35) {
      uVar9 = 0;
    }
    uVar7 = (ms->cParams).searchLog;
    uVar11 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                        (BYTE *)(ulong)(ms->cParams).hashLog,UVar38);
    if (uVar21 < uVar11) {
      iVar15 = 1 << ((byte)uVar7 & 0x1f);
      uVar27 = 999999999;
      uVar17 = 3;
      do {
        puVar31 = (ulong *)(pBVar29 + uVar11);
        if (*(char *)(uVar17 + (long)puVar31) == *(char *)((long)puVar36 + uVar17)) {
          puVar19 = puVar36;
          if (puVar36 < puVar1) {
            if (*puVar31 == *puVar36) {
              lVar16 = (ulong)uVar11 + 8;
              lVar34 = 0;
              do {
                puVar19 = (ulong *)((long)puVar36 + lVar34 + 8);
                if (puVar1 <= puVar19) {
                  puVar31 = (ulong *)(pBVar29 + lVar34 + lVar16);
                  goto LAB_004de302;
                }
                lVar10 = lVar34 + lVar16;
                lVar34 = lVar34 + 8;
              } while (*(ulong *)(pBVar29 + lVar10) == *puVar19);
              uVar24 = *puVar19 ^ *(ulong *)(pBVar29 + lVar10);
              uVar25 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar25 = (uVar25 >> 3 & 0x1fffffff) + lVar34;
            }
            else {
              uVar24 = *puVar36 ^ *puVar31;
              uVar25 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar25 = uVar25 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_004de302:
            if ((puVar19 < puVar2) && ((int)*puVar31 == (int)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar19 < puVar3) && ((short)*puVar31 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar19 < puVar4) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar31 == (char)*puVar19));
            }
            uVar25 = (long)puVar19 - (long)puVar36;
          }
          if ((uVar17 < uVar25) &&
             (uVar27 = (ulong)((uVar37 + 2) - uVar11), uVar17 = uVar25,
             (ulong *)((long)puVar36 + uVar25) == puVar4)) goto LAB_004de52f;
        }
        uVar25 = uVar17;
        if ((uVar11 <= uVar9) ||
           ((uVar11 = pUVar8[uVar11 & uVar35 - 1], uVar11 <= uVar21 ||
            (iVar15 = iVar15 + -1, uVar17 = uVar25, iVar15 == 0)))) goto LAB_004de52f;
      } while( true );
    }
  }
  else {
    uVar11 = (ms->cParams).chainLog;
    uVar35 = 1 << ((byte)uVar11 & 0x1f);
    pUVar8 = ms->chainTable;
    pBVar29 = (ms->window).base;
    uVar21 = (ms->window).lowLimit;
    uVar37 = UVar38 - (int)pBVar29;
    uVar9 = uVar37 - uVar35;
    if (uVar37 < uVar35) {
      uVar9 = 0;
    }
    uVar7 = (ms->cParams).searchLog;
    uVar11 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                        (BYTE *)(ulong)(ms->cParams).hashLog,UVar38);
    if (uVar21 < uVar11) {
      iVar15 = 1 << ((byte)uVar7 & 0x1f);
      uVar27 = 999999999;
      uVar17 = 3;
      do {
        puVar31 = (ulong *)(pBVar29 + uVar11);
        if (*(char *)(uVar17 + (long)puVar31) == *(char *)((long)puVar36 + uVar17)) {
          puVar19 = puVar36;
          if (puVar36 < puVar1) {
            if (*puVar31 == *puVar36) {
              lVar16 = (ulong)uVar11 + 8;
              lVar34 = 0;
              do {
                puVar19 = (ulong *)((long)puVar36 + lVar34 + 8);
                if (puVar1 <= puVar19) {
                  puVar31 = (ulong *)(pBVar29 + lVar34 + lVar16);
                  goto LAB_004de49e;
                }
                lVar10 = lVar34 + lVar16;
                lVar34 = lVar34 + 8;
              } while (*(ulong *)(pBVar29 + lVar10) == *puVar19);
              uVar24 = *puVar19 ^ *(ulong *)(pBVar29 + lVar10);
              uVar25 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar25 = (uVar25 >> 3 & 0x1fffffff) + lVar34;
            }
            else {
              uVar24 = *puVar36 ^ *puVar31;
              uVar25 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar25 = uVar25 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_004de49e:
            if ((puVar19 < puVar2) && ((int)*puVar31 == (int)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar19 < puVar3) && ((short)*puVar31 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar19 < puVar4) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar31 == (char)*puVar19));
            }
            uVar25 = (long)puVar19 - (long)puVar36;
          }
          if ((uVar17 < uVar25) &&
             (uVar27 = (ulong)((uVar37 + 2) - uVar11), uVar17 = uVar25,
             (ulong *)((long)puVar36 + uVar25) == puVar4)) goto LAB_004de52f;
        }
        uVar25 = uVar17;
        if ((uVar11 <= uVar9) ||
           ((uVar11 = pUVar8[uVar11 & uVar35 - 1], uVar11 <= uVar21 ||
            (iVar15 = iVar15 + -1, uVar17 = uVar25, iVar15 == 0)))) goto LAB_004de52f;
      } while( true );
    }
  }
  uVar25 = 3;
  uVar27 = 999999999;
LAB_004de52f:
  uVar17 = uVar23;
  if (uVar23 < uVar25) {
    uVar17 = uVar25;
  }
  if (3 < uVar17) {
    puVar31 = puVar36;
    if (uVar25 <= uVar23) {
      uVar27 = 0;
      puVar31 = (ulong *)((long)puVar36 + 1U);
    }
    puVar19 = (ulong *)((long)puVar36 + 0xd);
    local_98 = (long)puVar36 + 9;
LAB_004de596:
    local_70 = puVar31;
    uVar23 = uVar17;
    uVar30 = uVar27;
    if (puVar36 < puVar26) {
      puVar31 = (ulong *)((long)puVar36 + 1);
      if (uVar27 == 0) {
        uVar30 = 0;
      }
      else if ((uVar20 != 0) && (*(int *)puVar31 == *(int *)((long)puVar31 + lVar33))) {
        puVar18 = (ulong *)((long)puVar36 + 5);
        puVar13 = (ulong *)((long)puVar36 + lVar33 + 5);
        puVar12 = puVar18;
        if (puVar18 < puVar1) {
          puVar12 = puVar19;
          if (*puVar13 == *puVar18) {
            do {
              if (puVar1 <= puVar12) {
                puVar13 = (ulong *)((long)puVar12 + lVar33);
                goto LAB_004debdf;
              }
              puVar13 = (ulong *)((long)puVar12 + lVar33);
              uVar28 = *puVar12;
              puVar12 = puVar12 + 1;
            } while (*puVar13 == uVar28);
            uVar28 = uVar28 ^ *puVar13;
            uVar17 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            puVar12 = (ulong *)((long)puVar12 + ((uVar17 >> 3 & 0x1fffffff) - 8));
            goto LAB_004dec24;
          }
          uVar17 = *puVar18 ^ *puVar13;
          uVar28 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar28 = uVar28 >> 3 & 0x1fffffff;
          uVar21 = (int)uVar27 + 1;
          uVar11 = 0x1f;
          if (uVar21 != 0) {
            for (; uVar21 >> uVar11 == 0; uVar11 = uVar11 - 1) {
            }
          }
        }
        else {
LAB_004debdf:
          if ((puVar12 < puVar2) && ((int)*puVar13 == (int)*puVar12)) {
            puVar12 = (ulong *)((long)puVar12 + 4);
            puVar13 = (ulong *)((long)puVar13 + 4);
          }
          if ((puVar12 < puVar3) && ((short)*puVar13 == (short)*puVar12)) {
            puVar12 = (ulong *)((long)puVar12 + 2);
            puVar13 = (ulong *)((long)puVar13 + 2);
          }
          if (puVar12 < puVar4) {
            puVar12 = (ulong *)((long)puVar12 + (ulong)((char)*puVar13 == (char)*puVar12));
          }
LAB_004dec24:
          uVar28 = (long)puVar12 - (long)puVar18;
          if (0xfffffffffffffffb < uVar28) goto LAB_004de62c;
          uVar21 = (int)uVar27 + 1;
          uVar11 = 0x1f;
          if (uVar21 != 0) {
            for (; uVar21 >> uVar11 == 0; uVar11 = uVar11 - 1) {
            }
          }
        }
        if ((int)((uVar11 ^ 0x1f) + (int)uVar23 * 3 + -0x1e) < (int)(uVar28 + 4) * 3) {
          uVar23 = uVar28 + 4;
          uVar30 = 0;
          local_70 = puVar31;
        }
      }
LAB_004de62c:
      uVar11 = (ms->cParams).minMatch;
      UVar38 = (U32)puVar31;
      if (uVar11 - 6 < 2) {
        uVar11 = (ms->cParams).chainLog;
        uVar37 = 1 << ((byte)uVar11 & 0x1f);
        pUVar8 = ms->chainTable;
        pBVar29 = (ms->window).base;
        uVar21 = (ms->window).lowLimit;
        uVar35 = UVar38 - (int)pBVar29;
        uVar9 = uVar35 - uVar37;
        if (uVar35 < uVar37) {
          uVar9 = 0;
        }
        uVar7 = (ms->cParams).searchLog;
        uVar11 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                            (BYTE *)(ulong)(ms->cParams).hashLog,UVar38);
        if (uVar21 < uVar11) {
          iVar15 = 1 << ((byte)uVar7 & 0x1f);
          uVar27 = 999999999;
          uVar28 = 3;
          do {
            puVar36 = (ulong *)(pBVar29 + uVar11);
            if (*(char *)(uVar28 + (long)puVar36) == *(char *)((long)puVar31 + uVar28)) {
              puVar13 = puVar31;
              if (puVar31 < puVar1) {
                if (*puVar36 == *puVar31) {
                  lVar16 = (ulong)uVar11 + 8;
                  lVar34 = 0;
                  do {
                    puVar13 = (ulong *)(local_98 + lVar34);
                    if (puVar1 <= puVar13) {
                      puVar36 = (ulong *)(pBVar29 + lVar34 + lVar16);
                      goto LAB_004de77b;
                    }
                    lVar10 = lVar34 + lVar16;
                    lVar34 = lVar34 + 8;
                  } while (*(ulong *)(pBVar29 + lVar10) == *puVar13);
                  uVar25 = *puVar13 ^ *(ulong *)(pBVar29 + lVar10);
                  uVar17 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  uVar17 = (uVar17 >> 3 & 0x1fffffff) + lVar34;
                }
                else {
                  uVar25 = *puVar31 ^ *puVar36;
                  uVar17 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  uVar17 = uVar17 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_004de77b:
                if ((puVar13 < puVar2) && ((int)*puVar36 == (int)*puVar13)) {
                  puVar13 = (ulong *)((long)puVar13 + 4);
                  puVar36 = (ulong *)((long)puVar36 + 4);
                }
                if ((puVar13 < puVar3) && ((short)*puVar36 == (short)*puVar13)) {
                  puVar13 = (ulong *)((long)puVar13 + 2);
                  puVar36 = (ulong *)((long)puVar36 + 2);
                }
                if (puVar13 < puVar4) {
                  puVar13 = (ulong *)((long)puVar13 + (ulong)((char)*puVar36 == (char)*puVar13));
                }
                uVar17 = (long)puVar13 - (long)puVar31;
              }
              if ((uVar28 < uVar17) &&
                 (uVar27 = (ulong)((uVar35 + 2) - uVar11), uVar28 = uVar17,
                 (ulong *)(uVar17 + (long)puVar31) == puVar4)) goto LAB_004deb65;
            }
            uVar17 = uVar28;
            if ((uVar11 <= uVar9) ||
               ((uVar11 = pUVar8[uVar11 & uVar37 - 1], uVar11 <= uVar21 ||
                (iVar15 = iVar15 + -1, uVar28 = uVar17, iVar15 == 0)))) goto LAB_004deb65;
          } while( true );
        }
      }
      else if (uVar11 == 5) {
        uVar11 = (ms->cParams).chainLog;
        uVar35 = 1 << ((byte)uVar11 & 0x1f);
        pUVar8 = ms->chainTable;
        pBVar29 = (ms->window).base;
        uVar21 = (ms->window).lowLimit;
        uVar37 = UVar38 - (int)pBVar29;
        uVar9 = uVar37 - uVar35;
        if (uVar37 < uVar35) {
          uVar9 = 0;
        }
        uVar7 = (ms->cParams).searchLog;
        uVar11 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                            (BYTE *)(ulong)(ms->cParams).hashLog,UVar38);
        if (uVar21 < uVar11) {
          iVar15 = 1 << ((byte)uVar7 & 0x1f);
          uVar27 = 999999999;
          uVar28 = 3;
          do {
            puVar13 = (ulong *)(pBVar29 + uVar11);
            if (*(char *)(uVar28 + (long)puVar13) == *(char *)((long)puVar31 + uVar28)) {
              puVar18 = puVar31;
              if (puVar31 < puVar1) {
                if (*puVar13 == *puVar31) {
                  lVar16 = (ulong)uVar11 + 8;
                  lVar34 = 0;
                  do {
                    if (puVar1 <= (ulong *)(local_98 + lVar34)) {
                      puVar13 = (ulong *)(pBVar29 + lVar34 + lVar16);
                      puVar18 = (ulong *)(local_98 + lVar34);
                      goto LAB_004de93a;
                    }
                    lVar10 = lVar34 + lVar16;
                    uVar17 = *(ulong *)((long)puVar36 + lVar34 + 9);
                    lVar34 = lVar34 + 8;
                  } while (*(ulong *)(pBVar29 + lVar10) == uVar17);
                  uVar17 = uVar17 ^ *(ulong *)(pBVar29 + lVar10);
                  uVar25 = 0;
                  if (uVar17 != 0) {
                    for (; (uVar17 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                    }
                  }
                  uVar17 = (uVar25 >> 3 & 0x1fffffff) + lVar34;
                }
                else {
                  uVar25 = *puVar31 ^ *puVar13;
                  uVar17 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  uVar17 = uVar17 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_004de93a:
                if ((puVar18 < puVar2) && ((int)*puVar13 == (int)*puVar18)) {
                  puVar18 = (ulong *)((long)puVar18 + 4);
                  puVar13 = (ulong *)((long)puVar13 + 4);
                }
                if ((puVar18 < puVar3) && ((short)*puVar13 == (short)*puVar18)) {
                  puVar18 = (ulong *)((long)puVar18 + 2);
                  puVar13 = (ulong *)((long)puVar13 + 2);
                }
                if (puVar18 < puVar4) {
                  puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar13 == (char)*puVar18));
                }
                uVar17 = (long)puVar18 - (long)puVar31;
              }
              if ((uVar28 < uVar17) &&
                 (uVar27 = (ulong)((uVar37 + 2) - uVar11), uVar28 = uVar17,
                 (ulong *)(uVar17 + (long)puVar31) == puVar4)) goto LAB_004deb65;
            }
            uVar17 = uVar28;
            if ((uVar11 <= uVar9) ||
               ((uVar11 = pUVar8[uVar11 & uVar35 - 1], uVar11 <= uVar21 ||
                (iVar15 = iVar15 + -1, uVar28 = uVar17, iVar15 == 0)))) goto LAB_004deb65;
          } while( true );
        }
      }
      else {
        uVar11 = (ms->cParams).chainLog;
        uVar37 = 1 << ((byte)uVar11 & 0x1f);
        pUVar8 = ms->chainTable;
        pBVar29 = (ms->window).base;
        uVar21 = (ms->window).lowLimit;
        uVar35 = UVar38 - (int)pBVar29;
        uVar9 = uVar35 - uVar37;
        if (uVar35 < uVar37) {
          uVar9 = 0;
        }
        uVar7 = (ms->cParams).searchLog;
        uVar11 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)uVar11,
                            (BYTE *)(ulong)(ms->cParams).hashLog,UVar38);
        if (uVar21 < uVar11) {
          iVar15 = 1 << ((byte)uVar7 & 0x1f);
          uVar27 = 999999999;
          uVar28 = 3;
          do {
            puVar36 = (ulong *)(pBVar29 + uVar11);
            if (*(char *)(uVar28 + (long)puVar36) == *(char *)((long)puVar31 + uVar28)) {
              puVar13 = puVar31;
              if (puVar31 < puVar1) {
                if (*puVar36 == *puVar31) {
                  lVar16 = (ulong)uVar11 + 8;
                  lVar34 = 0;
                  do {
                    puVar13 = (ulong *)(local_98 + lVar34);
                    if (puVar1 <= puVar13) {
                      puVar36 = (ulong *)(pBVar29 + lVar34 + lVar16);
                      goto LAB_004deae6;
                    }
                    lVar10 = lVar34 + lVar16;
                    lVar34 = lVar34 + 8;
                  } while (*(ulong *)(pBVar29 + lVar10) == *puVar13);
                  uVar25 = *puVar13 ^ *(ulong *)(pBVar29 + lVar10);
                  uVar17 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  uVar17 = (uVar17 >> 3 & 0x1fffffff) + lVar34;
                }
                else {
                  uVar25 = *puVar31 ^ *puVar36;
                  uVar17 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  uVar17 = uVar17 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_004deae6:
                if ((puVar13 < puVar2) && ((int)*puVar36 == (int)*puVar13)) {
                  puVar13 = (ulong *)((long)puVar13 + 4);
                  puVar36 = (ulong *)((long)puVar36 + 4);
                }
                if ((puVar13 < puVar3) && ((short)*puVar36 == (short)*puVar13)) {
                  puVar13 = (ulong *)((long)puVar13 + 2);
                  puVar36 = (ulong *)((long)puVar36 + 2);
                }
                if (puVar13 < puVar4) {
                  puVar13 = (ulong *)((long)puVar13 + (ulong)((char)*puVar36 == (char)*puVar13));
                }
                uVar17 = (long)puVar13 - (long)puVar31;
              }
              if ((uVar28 < uVar17) &&
                 (uVar27 = (ulong)((uVar35 + 2) - uVar11), uVar28 = uVar17,
                 (ulong *)(uVar17 + (long)puVar31) == puVar4)) goto LAB_004deb65;
            }
            uVar17 = uVar28;
            if ((uVar11 <= uVar9) ||
               ((uVar11 = pUVar8[uVar11 & uVar37 - 1], uVar11 <= uVar21 ||
                (iVar15 = iVar15 + -1, uVar28 = uVar17, iVar15 == 0)))) goto LAB_004deb65;
          } while( true );
        }
      }
    }
    goto LAB_004dec8a;
  }
  puVar36 = (ulong *)((long)puVar36 + ((long)puVar36 - (long)src >> 8) + 1);
  goto LAB_004def11;
LAB_004deb65:
  if (uVar17 < 4) goto LAB_004dec8a;
  uVar21 = (int)uVar30 + 1;
  uVar11 = 0x1f;
  if (uVar21 != 0) {
    for (; uVar21 >> uVar11 == 0; uVar11 = uVar11 - 1) {
    }
  }
  uVar21 = (int)uVar27 + 1;
  iVar15 = 0x1f;
  if (uVar21 != 0) {
    for (; uVar21 >> iVar15 == 0; iVar15 = iVar15 + -1) {
    }
  }
  puVar19 = (ulong *)((long)puVar19 + 1);
  local_98 = local_98 + 1;
  puVar36 = puVar31;
  if ((int)uVar17 * 4 - iVar15 <= (int)((uVar11 ^ 0x1f) + (int)uVar23 * 4 + -0x1b))
  goto LAB_004dec8a;
  goto LAB_004de596;
LAB_004dec8a:
  if (uVar30 == 0) {
    UVar38 = 1;
    uVar11 = uVar20;
  }
  else {
    if ((src < local_70) && (pBVar22 < (BYTE *)((long)local_70 + (2 - uVar30)))) {
      puVar36 = local_70;
      while (local_70 = puVar36,
            *(char *)((long)puVar36 - 1) == *(char *)((long)puVar36 + (1 - uVar30))) {
        local_70 = (ulong *)((long)puVar36 - 1);
        uVar23 = uVar23 + 1;
        if ((local_70 <= src) ||
           (pBVar29 = (BYTE *)((long)puVar36 + (1 - uVar30)), puVar36 = local_70, pBVar29 <= pBVar22
           )) break;
      }
    }
    UVar38 = (int)uVar30 + 1;
    uVar11 = (int)uVar30 - 2;
    uVar39 = uVar20;
  }
  uVar30 = (ulong)uVar39;
  uVar28 = (ulong)uVar11;
  uVar27 = (long)local_70 - (long)src;
  puVar31 = (ulong *)seqStore->lit;
  puVar36 = (ulong *)((long)puVar31 + uVar27);
  do {
    *puVar31 = *src;
    puVar31 = puVar31 + 1;
    src = (void *)((long)src + 8);
  } while (puVar31 < puVar36);
  seqStore->lit = seqStore->lit + uVar27;
  if (uVar27 < 0x10000) {
    psVar14 = seqStore->sequences;
  }
  else {
    seqStore->longLengthID = 1;
    psVar14 = seqStore->sequences;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar14->litLength = (U16)uVar27;
  psVar14->offset = UVar38;
  if (0xffff < uVar23 - 3) {
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar14->matchLength = (U16)(uVar23 - 3);
  seqStore->sequences = psVar14 + 1;
  src = (void *)((long)local_70 + uVar23);
  puVar36 = (ulong *)src;
  if ((uVar39 != 0) && (src <= puVar26)) {
    while (uVar27 = uVar28, uVar23 = uVar30, uVar28 = uVar27, puVar36 = (ulong *)src,
          uVar30 = uVar23, (int)*src == *(int *)((long)src - uVar23)) {
      lVar33 = -uVar23;
      puVar36 = (ulong *)((long)src + 4);
      puVar19 = (ulong *)((long)src + lVar33 + 4);
      puVar31 = puVar36;
      if (puVar36 < puVar1) {
        if (*puVar19 == *puVar36) {
          lVar16 = 0;
          do {
            puVar31 = (ulong *)((long)src + lVar16 + 0xc);
            if (puVar1 <= puVar31) {
              puVar19 = (ulong *)((long)src + lVar33 + lVar16 + 0xc);
              puVar31 = (ulong *)((long)src + lVar16 + 0xc);
              goto LAB_004dee53;
            }
            uVar30 = *(ulong *)((long)src + lVar16 + lVar33 + 0xc);
            uVar28 = *puVar31;
            lVar16 = lVar16 + 8;
          } while (uVar30 == uVar28);
          uVar28 = uVar28 ^ uVar30;
          uVar30 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
            }
          }
          uVar30 = (uVar30 >> 3 & 0x1fffffff) + lVar16;
        }
        else {
          uVar28 = *puVar36 ^ *puVar19;
          uVar30 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
            }
          }
          uVar30 = uVar30 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_004dee53:
        if ((puVar31 < puVar2) && ((int)*puVar19 == (int)*puVar31)) {
          puVar31 = (ulong *)((long)puVar31 + 4);
          puVar19 = (ulong *)((long)puVar19 + 4);
        }
        if ((puVar31 < puVar3) && ((short)*puVar19 == (short)*puVar31)) {
          puVar31 = (ulong *)((long)puVar31 + 2);
          puVar19 = (ulong *)((long)puVar19 + 2);
        }
        if (puVar31 < puVar4) {
          puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar19 == (char)*puVar31));
        }
        uVar30 = (long)puVar31 - (long)puVar36;
      }
      *(ulong *)seqStore->lit = *src;
      psVar14 = seqStore->sequences;
      psVar14->litLength = 0;
      psVar14->offset = 1;
      if (0xffff < uVar30 + 1) {
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar14->matchLength = (U16)(uVar30 + 1);
      seqStore->sequences = psVar14 + 1;
      src = (void *)((long)src + uVar30 + 4);
      uVar28 = uVar23;
      puVar36 = (ulong *)src;
      uVar30 = uVar27;
      if (((int)uVar27 == 0) || (puVar26 < src)) break;
    }
  }
LAB_004def11:
  uVar39 = (uint)uVar30;
  uVar20 = (uint)uVar28;
  if (puVar26 <= puVar36) goto LAB_004def2f;
  goto LAB_004ddf09;
}

Assistant:

size_t ZSTD_compressBlock_lazy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 0, 1, ZSTD_noDict);
}